

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall
QString::arg_impl(QString *__return_storage_ptr__,QString *this,qulonglong a,int fieldWidth,int base
                 ,QChar fillChar)

{
  Data *pDVar1;
  uint flags;
  QStringView arg;
  QStringView larg;
  undefined1 *puVar2;
  int iVar3;
  NumberOptions NVar4;
  undefined4 extraout_var;
  QArrayData *data;
  QArrayData *data_00;
  storage_type_conflict *psVar5;
  ArgEscapeData *__return_storage_ptr___00;
  storage_type_conflict *psVar7;
  qsizetype qVar8;
  qsizetype qVar9;
  long in_FS_OFFSET;
  QStringView s;
  QStringView s_00;
  QLocale locale;
  QLocale local_80;
  QMessageLogger local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  void *pvVar6;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr___00 = (ArgEscapeData *)&local_58;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  pvVar6 = (void *)(this->d).size;
  s.m_data = (this->d).ptr;
  s.m_size = (qsizetype)pvVar6;
  findArgEscapes(__return_storage_ptr___00,s);
  puVar2 = local_48;
  if (puStack_50 == (undefined1 *)0x0) {
    local_78.context.version = 2;
    local_78.context.line = 0;
    local_78.context.file._0_4_ = 0;
    local_78.context.file._4_4_ = 0;
    local_78.context.function._0_4_ = 0;
    local_78.context.function._4_4_ = 0;
    local_78.context.category = "default";
    if ((this->d).d == (Data *)0x0) {
      reallocData(this,(this->d).size,KeepSize);
    }
    QMessageLogger::warning
              (&local_78,"QString::arg: Argument missing: \"%ls\", %lld",(this->d).ptr,a);
    pDVar1 = (this->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (this->d).ptr;
    (__return_storage_ptr__->d).size = (this->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    flags = (uint)(fillChar.ucs == L'0') * 2;
    qVar9 = 0;
    psVar5 = (storage_type_conflict *)0x0;
    data = (QArrayData *)0x0;
    if ((long)local_48 < (long)puStack_50) {
      iVar3 = QLocaleData::c(__return_storage_ptr___00,pvVar6);
      QLocaleData::unsLongLongToString
                ((QString *)&local_78,(QLocaleData *)CONCAT44(extraout_var,iVar3),a,-1,base,
                 fieldWidth,flags);
      data = (QArrayData *)CONCAT44(local_78.context.line,local_78.context.version);
      psVar5 = (storage_type_conflict *)
               CONCAT44(local_78.context.file._4_4_,local_78.context.file._0_4_);
      qVar9 = CONCAT44(local_78.context.function._4_4_,local_78.context.function._0_4_);
    }
    if ((long)puVar2 < 1) {
      psVar7 = (storage_type_conflict *)0x0;
      qVar8 = 0;
      data_00 = (QArrayData *)0x0;
    }
    else {
      local_80.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QLocale::QLocale(&local_80);
      NVar4 = QLocale::numberOptions(&local_80);
      if ((((QBasicAtomicInt *)((long)local_80.d.d.ptr + 8))->_q_value).super___atomic_base<int>.
          _M_i != 1) {
        QSharedDataPointer<QLocalePrivate>::detach_helper(&local_80.d);
      }
      QLocaleData::unsLongLongToString
                ((QString *)&local_78,*(QLocaleData **)local_80.d.d.ptr,a,-1,base,fieldWidth,
                 (((uint)NVar4.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                         super_QFlagsStorage<QLocale::NumberOption>.i & 1) << 5 | flags) ^ 0x20);
      data_00 = (QArrayData *)CONCAT44(local_78.context.line,local_78.context.version);
      psVar7 = (storage_type_conflict *)
               CONCAT44(local_78.context.file._4_4_,local_78.context.file._0_4_);
      qVar8 = CONCAT44(local_78.context.function._4_4_,local_78.context.function._0_4_);
      QLocale::~QLocale(&local_80);
    }
    arg.m_data = psVar5;
    arg.m_size = qVar9;
    larg.m_data = psVar7;
    larg.m_size = qVar8;
    s_00.m_data = (this->d).ptr;
    s_00.m_size = (this->d).size;
    replaceArgEscapes(__return_storage_ptr__,s_00,(ArgEscapeData *)&local_58,(long)fieldWidth,arg,
                      larg,fillChar);
    if (data_00 != (QArrayData *)0x0) {
      LOCK();
      (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
           (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data_00,2,0x10);
      }
    }
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QString::arg_impl(qulonglong a, int fieldWidth, int base, QChar fillChar) const
{
    ArgEscapeData d = findArgEscapes(*this);

    if (d.occurrences == 0) {
        qWarning("QString::arg: Argument missing: \"%ls\", %lld", qUtf16Printable(*this), a);
        return *this;
    }

    unsigned flags = QLocaleData::NoFlags;
    // ZeroPadded sorts out left-padding when the fill is zero, to the right of sign:
    if (fillChar == u'0')
        flags = QLocaleData::ZeroPadded;

    QString arg;
    if (d.occurrences > d.locale_occurrences) {
        arg = QLocaleData::c()->unsLongLongToString(a, -1, base, fieldWidth, flags);
        Q_ASSERT(fillChar != u'0' || fieldWidth <= arg.size());
    }

    QString localeArg;
    if (d.locale_occurrences > 0) {
        QLocale locale;
        if (!(locale.numberOptions() & QLocale::OmitGroupSeparator))
            flags |= QLocaleData::GroupDigits;
        localeArg = locale.d->m_data->unsLongLongToString(a, -1, base, fieldWidth, flags);
        Q_ASSERT(fillChar != u'0' || fieldWidth <= localeArg.size());
    }

    return replaceArgEscapes(*this, d, fieldWidth, arg, localeArg, fillChar);
}